

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

void wdebugoutput(WCHAR *wbuf)

{
  return;
}

Assistant:

void wdebugoutput(const WCHAR *wbuf)
{
#if DBG_WCHAROUTPUT&DBG_OUTPUTDEBUGSTRING
    if (g_debugOutputFlags&DBG_OUTPUTDEBUGSTRING) {
        int len= _tcslen(wbuf);
        for (int i= 0 ; i<len ; i+=512)
        {
            WCHAR smallbuf[513];
            wcsncpy(smallbuf, wbuf+i, 512);
            smallbuf[512]= 0;
            OutputDebugString(smallbuf);
        }
    }
#endif
#if DBG_WCHAROUTPUT&DBG_MESSAGEBOX
#ifndef _NO_WINDOWS
    if (g_debugOutputFlags&DBG_MESSAGEBOX) {
        MessageBox(0,wbuf,L"debug",0);
    }
#endif
#endif
#if DBG_WCHAROUTPUT&DBG_DEBUGWINDOW
    if (g_debugOutputFlags&DBG_DEBUGWINDOW && g_debugWindow) {
        g_debugWindow->appendString(wbuf);
    }
#endif
#if DBG_WCHAROUTPUT&DBG_STDOUT
    if (g_debugOutputFlags&DBG_STDOUT) {
        fputws(wbuf, stdout);
    }
#endif
#if DBG_WCHAROUTPUT&DBG_LOGFILE
    if (g_debugOutputFlags&DBG_LOGFILE) {
#ifdef WIN32
        if (WaitForSingleObject(g_log_mutex, INFINITE)==WAIT_OBJECT_0)
#endif
        {
            FILE *f= fopen(g_logfilename.c_str(), "a+");
            if (f) {
                fputws(wbuf, f);
                fclose(f);
            }
#ifdef WIN32
            ReleaseMutex(g_log_mutex);
#endif
        }
    }
#endif
}